

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int generateOutputSubroutine
              (Parse *pParse,Select *p,SelectDest *pIn,SelectDest *pDest,int regReturn,int regPrev,
              KeyInfo *pKeyInfo,int p4type,int iBreak)

{
  u8 uVar1;
  int iVar2;
  Vdbe *p_00;
  char cVar3;
  byte bVar4;
  uint p2;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  p_00 = pParse->pVdbe;
  iVar2 = p_00->nOp;
  p2 = sqlite3VdbeMakeLabel(p_00);
  if (regPrev != 0) {
    uVar5 = sqlite3VdbeAddOp3(p_00,0x1c,regPrev,0,0);
    iVar6 = sqlite3VdbeAddOp3(p_00,0x18,pIn->iSdst,regPrev + 1,pIn->nSdst);
    sqlite3VdbeChangeP4(p_00,iVar6,(char *)pKeyInfo,p4type);
    sqlite3VdbeAddOp3(p_00,0x19,iVar6 + 2,p2,iVar6 + 2);
    if ((-1 < (int)uVar5) && (uVar5 < (uint)p_00->nOp)) {
      p_00->aOp[uVar5].p2 = p_00->nOp;
    }
    sqlite3VdbeAddOp3(p_00,0xe,pIn->iSdst,regPrev + 1,pIn->nSdst + -1);
    sqlite3VdbeAddOp3(p_00,7,1,regPrev,0);
  }
  if (pParse->db->mallocFailed != '\0') {
    return 0;
  }
  codeOffset(p_00,p,p2);
  switch(pDest->eDest) {
  case '\x06':
    sqlite3ExprCodeMove(pParse,pIn->iSdst,pDest->iSDParm,1);
    break;
  case '\a':
    cVar3 = sqlite3CompareAffinity(p->pEList->a->pExpr,pDest->affSdst);
    pDest->affSdst = cVar3;
    if (pParse->nTempReg == '\0') {
      iVar6 = pParse->nMem + 1;
      pParse->nMem = iVar6;
    }
    else {
      bVar4 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar4;
      iVar6 = pParse->aTempReg[bVar4];
    }
    iVar8 = sqlite3VdbeAddOp3(p_00,0x1f,pIn->iSdst,1,iVar6);
    sqlite3VdbeChangeP4(p_00,iVar8,&pDest->affSdst,1);
    sqlite3ExprCacheRemove(pParse,pIn->iSdst,1);
    sqlite3VdbeAddOp3(p_00,0x61,pDest->iSDParm,iVar6,0);
    if (iVar6 != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        lVar7 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar7) == iVar6) {
            (&pParse->aColCache[0].tempReg)[lVar7] = '\x01';
            goto LAB_0019263d;
          }
          lVar7 = lVar7 + 0x18;
        } while ((int)lVar7 != 0xf0);
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = iVar6;
      }
    }
    break;
  case '\b':
  case '\t':
    uVar1 = pParse->nTempReg;
    if (uVar1 == '\0') {
      iVar6 = pParse->nMem + 1;
      pParse->nMem = iVar6;
LAB_00192461:
      iVar8 = pParse->nMem + 1;
      pParse->nMem = iVar8;
    }
    else {
      bVar4 = uVar1 - 1;
      pParse->nTempReg = bVar4;
      iVar6 = pParse->aTempReg[bVar4];
      if (bVar4 == 0) goto LAB_00192461;
      pParse->nTempReg = uVar1 - 2;
      iVar8 = pParse->aTempReg[(byte)(uVar1 - 2)];
    }
    sqlite3VdbeAddOp3(p_00,0x1f,pIn->iSdst,pIn->nSdst,iVar6);
    sqlite3VdbeAddOp3(p_00,0x38,pDest->iSDParm,iVar8,0);
    sqlite3VdbeAddOp3(p_00,0x39,pDest->iSDParm,iVar6,iVar8);
    if (p_00->aOp != (Op *)0x0) {
      p_00->aOp[(long)p_00->nOp + -1].p5 = '\b';
    }
    if (iVar8 != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        lVar7 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar7) == iVar8) {
            (&pParse->aColCache[0].tempReg)[lVar7] = '\x01';
            goto LAB_001925d3;
          }
          lVar7 = lVar7 + 0x18;
        } while ((int)lVar7 != 0xf0);
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = iVar8;
      }
    }
LAB_001925d3:
    if (iVar6 != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        lVar7 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar7) == iVar6) {
            (&pParse->aColCache[0].tempReg)[lVar7] = '\x01';
            goto LAB_0019263d;
          }
          lVar7 = lVar7 + 0x18;
        } while ((int)lVar7 != 0xf0);
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = iVar6;
      }
    }
    break;
  case '\n':
    iVar6 = pDest->iSdst;
    if (iVar6 == 0) {
      iVar8 = pIn->nSdst;
      if (pParse->nRangeReg < iVar8) {
        iVar6 = pParse->nMem + 1;
        pParse->nMem = pParse->nMem + iVar8;
      }
      else {
        iVar6 = pParse->iRangeReg;
        pParse->iRangeReg = iVar6 + iVar8;
        pParse->nRangeReg = pParse->nRangeReg - iVar8;
      }
      pDest->iSdst = iVar6;
      pDest->nSdst = iVar8;
    }
    else {
      iVar8 = pDest->nSdst;
    }
    sqlite3ExprCodeMove(pParse,pIn->iSdst,iVar6,iVar8);
    sqlite3VdbeAddOp3(p_00,4,pDest->iSDParm,0,0);
    break;
  default:
    sqlite3VdbeAddOp3(p_00,0x10,pIn->iSdst,pIn->nSdst,0);
    sqlite3ExprCacheRemove(pParse,pIn->iSdst,pIn->nSdst);
  }
LAB_0019263d:
  if (p->iLimit != 0) {
    sqlite3VdbeAddOp3(p_00,0x7a,p->iLimit,iBreak,-1);
  }
  if (p_00->aLabel != (int *)0x0) {
    p_00->aLabel[(int)~p2] = p_00->nOp;
  }
  sqlite3VdbeAddOp3(p_00,3,regReturn,0,0);
  return iVar2;
}

Assistant:

static int generateOutputSubroutine(
  Parse *pParse,          /* Parsing context */
  Select *p,              /* The SELECT statement */
  SelectDest *pIn,        /* Coroutine supplying data */
  SelectDest *pDest,      /* Where to send the data */
  int regReturn,          /* The return address register */
  int regPrev,            /* Previous result register.  No uniqueness if 0 */
  KeyInfo *pKeyInfo,      /* For comparing with previous entry */
  int p4type,             /* The p4 type for pKeyInfo */
  int iBreak              /* Jump here if we hit the LIMIT */
){
  Vdbe *v = pParse->pVdbe;
  int iContinue;
  int addr;

  addr = sqlite3VdbeCurrentAddr(v);
  iContinue = sqlite3VdbeMakeLabel(v);

  /* Suppress duplicates for UNION, EXCEPT, and INTERSECT 
  */
  if( regPrev ){
    int j1, j2;
    j1 = sqlite3VdbeAddOp1(v, OP_IfNot, regPrev);
    j2 = sqlite3VdbeAddOp4(v, OP_Compare, pIn->iSdst, regPrev+1, pIn->nSdst,
                              (char*)pKeyInfo, p4type);
    sqlite3VdbeAddOp3(v, OP_Jump, j2+2, iContinue, j2+2);
    sqlite3VdbeJumpHere(v, j1);
    sqlite3VdbeAddOp3(v, OP_Copy, pIn->iSdst, regPrev+1, pIn->nSdst-1);
    sqlite3VdbeAddOp2(v, OP_Integer, 1, regPrev);
  }
  if( pParse->db->mallocFailed ) return 0;

  /* Suppress the first OFFSET entries if there is an OFFSET clause
  */
  codeOffset(v, p, iContinue);

  switch( pDest->eDest ){
    /* Store the result as data using a unique key.
    */
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempReg(pParse);
      int r2 = sqlite3GetTempReg(pParse);
      testcase( pDest->eDest==SRT_Table );
      testcase( pDest->eDest==SRT_EphemTab );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, r1);
      sqlite3VdbeAddOp2(v, OP_NewRowid, pDest->iSDParm, r2);
      sqlite3VdbeAddOp3(v, OP_Insert, pDest->iSDParm, r1, r2);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      sqlite3ReleaseTempReg(pParse, r2);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      int r1;
      assert( pIn->nSdst==1 );
      pDest->affSdst = 
         sqlite3CompareAffinity(p->pEList->a[0].pExpr, pDest->affSdst);
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, pIn->iSdst, 1, r1, &pDest->affSdst,1);
      sqlite3ExprCacheAffinityChange(pParse, pIn->iSdst, 1);
      sqlite3VdbeAddOp2(v, OP_IdxInsert, pDest->iSDParm, r1);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#if 0  /* Never occurs on an ORDER BY query */
    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, pDest->iSDParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }
#endif

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell and break out
    ** of the scan loop.
    */
    case SRT_Mem: {
      assert( pIn->nSdst==1 );
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSDParm, 1);
      /* The LIMIT clause will jump out of the loop for us */
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    /* The results are stored in a sequence of registers
    ** starting at pDest->iSdst.  Then the co-routine yields.
    */
    case SRT_Coroutine: {
      if( pDest->iSdst==0 ){
        pDest->iSdst = sqlite3GetTempRange(pParse, pIn->nSdst);
        pDest->nSdst = pIn->nSdst;
      }
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSdst, pDest->nSdst);
      sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      break;
    }

    /* If none of the above, then the result destination must be
    ** SRT_Output.  This routine is never called with any other
    ** destination other than the ones handled above or SRT_Output.
    **
    ** For SRT_Output, results are stored in a sequence of registers.  
    ** Then the OP_ResultRow opcode is used to cause sqlite3_step() to
    ** return the next row of result.
    */
    default: {
      assert( pDest->eDest==SRT_Output );
      sqlite3VdbeAddOp2(v, OP_ResultRow, pIn->iSdst, pIn->nSdst);
      sqlite3ExprCacheAffinityChange(pParse, pIn->iSdst, pIn->nSdst);
      break;
    }
  }

  /* Jump to the end of the loop if the LIMIT is reached.
  */
  if( p->iLimit ){
    sqlite3VdbeAddOp3(v, OP_IfZero, p->iLimit, iBreak, -1);
  }

  /* Generate the subroutine return
  */
  sqlite3VdbeResolveLabel(v, iContinue);
  sqlite3VdbeAddOp1(v, OP_Return, regReturn);

  return addr;
}